

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

string * __thiscall iDynTree::Model::getJointName_abi_cxx11_(Model *this,JointIndex jointIndex)

{
  size_t sVar1;
  const_reference pvVar2;
  ostream *poVar3;
  char *pcVar4;
  size_type in_RDX;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  size_type local_18;
  
  local_18 = in_RDX;
  if ((-1 < (long)in_RDX) && (sVar1 = getNrOfJoints((Model *)0x44975b), (long)in_RDX < (long)sVar1))
  {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(in_RSI + 0x80),local_18);
    std::__cxx11::string::string((string *)in_RDI,(string *)pvVar2);
    return in_RDI;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = std::operator<<(local_190,"jointIndex ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
  poVar3 = std::operator<<(poVar3," is not valid, should be between 0 and ");
  sVar1 = getNrOfJoints((Model *)0x4497ef);
  std::ostream::operator<<(poVar3,sVar1 - 1);
  std::__cxx11::stringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iDynTree::reportError("Model","getJointName",pcVar4);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::string((string *)in_RDI,(string *)JOINT_INVALID_NAME_abi_cxx11_);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string Model::getJointName(const JointIndex jointIndex) const
{
    if( jointIndex >= 0 && jointIndex < (JointIndex)this->getNrOfJoints() )
    {
        return jointNames[jointIndex];
    }
    else
    {
        std::stringstream ss;
        ss << "jointIndex " << jointIndex << " is not valid, should be between 0 and " << this->getNrOfJoints()-1;
        reportError("Model","getJointName",ss.str().c_str());
        return JOINT_INVALID_NAME;
    }
}